

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

Array<unsigned_char> *
kj::anon_unknown_73::readAll
          (Array<unsigned_char> *__return_storage_ptr__,InputStream *input,uint64_t limit,
          bool nulTerminate)

{
  uint64_t uVar1;
  bool bVar2;
  WiderType<Decay<const_unsigned_long_&>,_Decay<unsigned_long_&>_> size;
  size_t sVar3;
  ulong uVar4;
  Array<unsigned_char> *pAVar5;
  uchar *puVar6;
  Vector<kj::Array<unsigned_char>_> *pVVar7;
  ArrayPtr<unsigned_char> AVar8;
  Fault local_138;
  Fault f_1;
  uchar **local_128;
  undefined1 local_120 [8];
  DebugComparison<unsigned_char_*&,_unsigned_char_*> _kjCondition_1;
  Array<unsigned_char> *p;
  Array<unsigned_char> *__end4;
  Array<unsigned_char> *__begin4;
  Vector<kj::Array<unsigned_char>_> *__range4;
  byte *pos;
  ArrayPtr<unsigned_char> local_c8;
  ulong local_b8;
  size_t n;
  Array<unsigned_char> part;
  Fault f;
  unsigned_long *local_80;
  undefined1 local_78 [8];
  DebugComparison<unsigned_long_&,_int> _kjCondition;
  size_t BLOCK_SIZE;
  Vector<kj::Array<unsigned_char>_> parts;
  uint64_t uStack_20;
  bool nulTerminate_local;
  uint64_t limit_local;
  InputStream *input_local;
  Array<unsigned_char> *result;
  
  parts.builder.disposer._7_1_ = nulTerminate;
  uStack_20 = limit;
  limit_local = (uint64_t)input;
  input_local = (InputStream *)__return_storage_ptr__;
  Vector<kj::Array<unsigned_char>_>::Vector((Vector<kj::Array<unsigned_char>_> *)&BLOCK_SIZE);
  _kjCondition.result = false;
  _kjCondition._33_7_ = 0x10;
  do {
    local_80 = (unsigned_long *)
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&stack0xffffffffffffffe0);
    f.exception._0_4_ = 0;
    kj::_::DebugExpression<unsigned_long&>::operator>
              ((DebugComparison<unsigned_long_&,_int> *)local_78,
               (DebugExpression<unsigned_long&> *)&local_80,(int *)&f);
    bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_78);
    if (!bVar2) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[26]>
                ((Fault *)&part.disposer,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                 ,0x4e,FAILED,"limit > 0","_kjCondition,\"Reached limit before EOF.\"",
                 (DebugComparison<unsigned_long_&,_int> *)local_78,
                 (char (*) [26])"Reached limit before EOF.");
      kj::_::Debug::Fault::fatal((Fault *)&part.disposer);
    }
    size = min<unsigned_long_const&,unsigned_long&>
                     ((unsigned_long *)&_kjCondition.result,&stack0xffffffffffffffe0);
    heapArray<unsigned_char>((Array<unsigned_char> *)&n,size);
    uVar1 = limit_local;
    AVar8 = kj::Array::operator_cast_to_ArrayPtr((Array *)&n);
    local_c8 = AVar8;
    sVar3 = Array<unsigned_char>::size((Array<unsigned_char> *)&n);
    uVar4 = (**(code **)(*(long *)uVar1 + 0x10))(uVar1,local_c8.ptr,local_c8.size_,sVar3);
    uStack_20 = uStack_20 - uVar4;
    local_b8 = uVar4;
    sVar3 = Array<unsigned_char>::size((Array<unsigned_char> *)&n);
    if (uVar4 < sVar3) {
      pos._7_1_ = 0;
      sVar3 = Vector<kj::Array<unsigned_char>_>::size
                        ((Vector<kj::Array<unsigned_char>_> *)&BLOCK_SIZE);
      heapArray<unsigned_char>
                (__return_storage_ptr__,
                 sVar3 * 0x1000 + local_b8 + (ulong)(parts.builder.disposer._7_1_ & 1));
      __range4 = (Vector<kj::Array<unsigned_char>_> *)
                 Array<unsigned_char>::begin(__return_storage_ptr__);
      __end4 = Vector<kj::Array<unsigned_char>_>::begin
                         ((Vector<kj::Array<unsigned_char>_> *)&BLOCK_SIZE);
      pAVar5 = Vector<kj::Array<unsigned_char>_>::end
                         ((Vector<kj::Array<unsigned_char>_> *)&BLOCK_SIZE);
      for (; pVVar7 = __range4, __end4 != pAVar5; __end4 = __end4 + 1) {
        _kjCondition_1._32_8_ = __end4;
        puVar6 = Array<unsigned_char>::begin(__end4);
        memcpy(pVVar7,puVar6,0x1000);
        __range4 = __range4 + 0x80;
      }
      puVar6 = Array<unsigned_char>::begin((Array<unsigned_char> *)&n);
      memcpy(pVVar7,puVar6,local_b8);
      pVVar7 = (Vector<kj::Array<unsigned_char>_> *)((long)&(__range4->builder).ptr + local_b8);
      __range4 = pVVar7;
      if ((parts.builder.disposer._7_1_ & 1) != 0) {
        __range4 = (Vector<kj::Array<unsigned_char>_> *)((long)&(pVVar7->builder).ptr + 1);
        *(undefined1 *)&(pVVar7->builder).ptr = 0;
      }
      local_128 = (uchar **)
                  kj::_::DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(uchar **)&__range4);
      f_1.exception = (Exception *)Array<unsigned_char>::end(__return_storage_ptr__);
      kj::_::DebugExpression<unsigned_char*&>::operator==
                ((DebugComparison<unsigned_char_*&,_unsigned_char_*> *)local_120,
                 (DebugExpression<unsigned_char*&> *)&local_128,(uchar **)&f_1);
      bVar2 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_120);
      if (!bVar2) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_char*&,unsigned_char*>&>
                  (&local_138,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/io.c++"
                   ,0x5c,FAILED,"pos == result.end()","_kjCondition,",
                   (DebugComparison<unsigned_char_*&,_unsigned_char_*> *)local_120);
        kj::_::Debug::Fault::fatal(&local_138);
      }
      bVar2 = true;
      pos._7_1_ = 1;
    }
    else {
      pAVar5 = mv<kj::Array<unsigned_char>>((Array<unsigned_char> *)&n);
      Vector<kj::Array<unsigned_char>>::add<kj::Array<unsigned_char>>
                ((Vector<kj::Array<unsigned_char>> *)&BLOCK_SIZE,pAVar5);
      bVar2 = false;
    }
    Array<unsigned_char>::~Array((Array<unsigned_char> *)&n);
    if (bVar2) {
      Vector<kj::Array<unsigned_char>_>::~Vector((Vector<kj::Array<unsigned_char>_> *)&BLOCK_SIZE);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

Array<byte> readAll(InputStream& input, uint64_t limit, bool nulTerminate) {
  Vector<Array<byte>> parts;
  constexpr size_t BLOCK_SIZE = 4096;

  for (;;) {
    KJ_REQUIRE(limit > 0, "Reached limit before EOF.");
    auto part = heapArray<byte>(kj::min(BLOCK_SIZE, limit));
    size_t n = input.tryRead(part, part.size());
    limit -= n;
    if (n < part.size()) {
      auto result = heapArray<byte>(parts.size() * BLOCK_SIZE + n + nulTerminate);
      byte* pos = result.begin();
      for (auto& p: parts) {
        memcpy(pos, p.begin(), BLOCK_SIZE);
        pos += BLOCK_SIZE;
      }
      memcpy(pos, part.begin(), n);
      pos += n;
      if (nulTerminate) *pos++ = '\0';
      KJ_ASSERT(pos == result.end());
      return result;
    } else {
      parts.add(kj::mv(part));
    }
  }
}